

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O0

void __thiscall serialization::xml_oarchive::~xml_oarchive(xml_oarchive *this)

{
  xml_oarchive *this_local;
  
  std::__cxx11::string::~string((string *)&this->str_);
  rapidxml::xml_document<char>::~xml_document(&this->document_);
  return;
}

Assistant:

xml_oarchive()
    {
    }